

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O0

Vec_Int_t * Mop_ManCollectStats(Mop_Man_t *p)

{
  int nSize;
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  word *p_01;
  word *pCube_00;
  int nOutLits;
  word *pCube;
  Vec_Int_t *vStats;
  int nVars;
  int iCube;
  int v;
  int i;
  Mop_Man_t *p_local;
  
  nSize = p->nWordsIn << 5;
  p_00 = Vec_IntStart(nSize);
  for (iCube = 0; iVar1 = Vec_IntSize(p->vCubes), iCube < iVar1; iCube = iCube + 1) {
    iVar1 = Vec_IntEntry(p->vCubes,iCube);
    p_01 = Mop_ManCubeIn(p,iVar1);
    pCube_00 = Mop_ManCubeOut(p,iVar1);
    iVar1 = Mop_ManCountOnes(pCube_00,p->nWordsOut);
    for (nVars = 0; nVars < nSize; nVars = nVars + 1) {
      iVar2 = Abc_TtGetQua(p_01,nVars);
      if (iVar2 != 0) {
        Vec_IntAddToEntry(p_00,nVars,iVar1);
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Mop_ManCollectStats( Mop_Man_t * p )
{
    int i, v, iCube, nVars = 32 * p->nWordsIn;
    Vec_Int_t * vStats = Vec_IntStart( nVars );
    Vec_IntForEachEntry( p->vCubes, iCube, i )
    {
        word * pCube = Mop_ManCubeIn(p, iCube);
        int nOutLits = Mop_ManCountOnes( Mop_ManCubeOut(p, iCube), p->nWordsOut );
        for ( v = 0; v < nVars; v++ )
            if ( Abc_TtGetQua(pCube, v) )
                Vec_IntAddToEntry( vStats, v, nOutLits );
    }
    return vStats;
}